

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

Edge * __thiscall
S2LaxPolygonShape::edge(Edge *__return_storage_ptr__,S2LaxPolygonShape *this,int e0)

{
  int iVar1;
  ostream *poVar2;
  type _v0;
  type _v1;
  uint *local_50;
  uint32 *next;
  uint local_40;
  int kMaxLinearSearchLoops;
  int e1;
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  uint local_14;
  S2LaxPolygonShape *pSStack_10;
  int e0_local;
  S2LaxPolygonShape *this_local;
  
  local_14 = e0;
  pSStack_10 = this;
  iVar1 = num_edges(this);
  local_29 = 0;
  if (iVar1 <= e0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar2 = S2LogMessage::stream(&local_28);
    poVar2 = std::operator<<(poVar2,"Check failed: (e0) < (num_edges()) ");
    S2LogMessageVoidify::operator&(&local_15,poVar2);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  local_40 = local_14 + 1;
  iVar1 = num_loops(this);
  if (iVar1 == 1) {
    if (local_40 == (this->field_2).num_vertices_) {
      local_40 = 0;
    }
  }
  else {
    local_50 = (this->field_2).cumulative_vertices_ + 1;
    iVar1 = num_loops(this);
    if (iVar1 < 0xd) {
      for (; *local_50 <= local_14; local_50 = local_50 + 1) {
      }
    }
    else {
      iVar1 = num_loops(this);
      local_50 = std::lower_bound<unsigned_int*,int>(local_50,local_50 + iVar1,(int *)&local_40);
    }
    if (local_40 == *local_50) {
      local_40 = local_50[-1];
    }
  }
  _v0 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                  (&this->vertices_,(long)(int)local_14);
  _v1 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                  (&this->vertices_,(long)(int)local_40);
  S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
  return __return_storage_ptr__;
}

Assistant:

S2Shape::Edge S2LaxPolygonShape::edge(int e0) const {
  S2_DCHECK_LT(e0, num_edges());
  int e1 = e0 + 1;
  if (num_loops() == 1) {
    if (e1 == num_vertices_) { e1 = 0; }
  } else {
    // Find the index of the first vertex of the loop following this one.
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    uint32* next = cumulative_vertices_ + 1;
    if (num_loops() <= kMaxLinearSearchLoops) {
      while (*next <= e0) ++next;
    } else {
      next = std::lower_bound(next, next + num_loops(), e1);
    }
    // Wrap around to the first vertex of the loop if necessary.
    if (e1 == *next) { e1 = next[-1]; }
  }
  return Edge(vertices_[e0], vertices_[e1]);
}